

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int decode_client_hello(ptls_context_t *ctx,st_ptls_client_hello_t *ch,uint8_t *src,uint8_t *end,
                       ptls_handshake_properties_t *properties,ptls_t *tls_cbarg)

{
  undefined1 *puVar1;
  uint *puVar2;
  byte bVar3;
  uint8_t uVar4;
  st_ptls_on_extension_t *psVar5;
  bool bVar6;
  uint16_t uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ptls_raw_extension_t *ppVar11;
  ushort extid;
  ptls_raw_extension_t *ppVar12;
  ulong uVar13;
  ptls_raw_extension_t *ppVar14;
  byte *pbVar15;
  ulong uVar16;
  ptls_raw_extension_t *ppVar17;
  ptls_raw_extension_t *ppVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  size_t *psVar23;
  uint32_t uVar24;
  long lVar25;
  byte *pbVar26;
  byte *pbVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  ptls_iovec_t pVar31;
  st_ptls_extension_bitmap_t bitmap;
  ptls_raw_extension_t *local_c8;
  uint local_bc;
  ptls_raw_extension_t *local_b8;
  ptls_raw_extension_t *local_b0;
  byte local_a3;
  byte local_a2;
  char local_a1;
  uint local_a0;
  uint16_t local_9a;
  ptls_t *local_98;
  ushort local_8a;
  ptls_t *local_88;
  ptls_handshake_properties_t *local_80;
  ptls_t *local_78;
  size_t *local_70;
  ptls_raw_extension_t *local_68;
  anon_struct_264_2_e44304f5_for_alpn *local_60;
  anon_struct_168_2_32182ca3_for_identities *local_58;
  ptls_iovec_t *local_50;
  st_ptls_signature_algorithms_t *local_48;
  ptls_context_t *local_40;
  st_ptls_extension_bitmap_t local_38;
  
  if ((long)end - (long)src < 2) {
    return 0x32;
  }
  ch->legacy_version = *(ushort *)src << 8 | *(ushort *)src >> 8;
  if (ch->legacy_version < 0x301) {
    return 0x46;
  }
  uVar8 = 0x32;
  if ((long)end - (long)(src + 2) < 0x20) {
    return 0x32;
  }
  ch->random_bytes = src + 2;
  local_c8 = (ptls_raw_extension_t *)(src + 0x22);
  if (local_c8 == (ptls_raw_extension_t *)end) {
LAB_00126337:
    bVar29 = false;
  }
  else {
    local_c8 = (ptls_raw_extension_t *)(src + 0x23);
    uVar13 = (ulong)src[0x22];
    if ((ulong)((long)end - (long)local_c8) < uVar13) goto LAB_00126337;
    bVar29 = src[0x22] < 0x21;
    if (bVar29) {
      (ch->legacy_session_id).base = (uint8_t *)local_c8;
      local_c8 = (ptls_raw_extension_t *)((long)&local_c8->type + uVar13);
      (ch->legacy_session_id).len = uVar13;
      uVar8 = 0;
    }
  }
  if (!bVar29) {
    return uVar8;
  }
  uVar19 = 0x32;
  if ((ulong)((long)end - (long)local_c8) < 2) {
LAB_00126388:
    bVar29 = false;
  }
  else {
    uVar16 = (long)end - (long)local_c8;
    lVar20 = -2;
    uVar13 = 0;
    ppVar12 = local_c8;
    do {
      local_c8 = (ptls_raw_extension_t *)((long)&ppVar12->type + 1);
      bVar3 = (byte)ppVar12->type;
      uVar13 = uVar13 << 8 | (ulong)bVar3;
      uVar16 = uVar16 - 1;
      lVar20 = lVar20 + 1;
      ppVar12 = local_c8;
    } while (lVar20 != 0);
    if (uVar16 < uVar13) goto LAB_00126388;
    bVar29 = (bVar3 & 1) == 0;
    if (bVar29) {
      (ch->cipher_suites).base = (uint8_t *)local_c8;
      local_c8 = (ptls_raw_extension_t *)((long)&local_c8->type + uVar13);
      (ch->cipher_suites).len = uVar13;
      uVar19 = uVar8;
    }
  }
  if (!bVar29) {
    return uVar19;
  }
  uVar8 = 0x32;
  if (local_c8 == (ptls_raw_extension_t *)end) {
LAB_001263b5:
    bVar29 = false;
  }
  else {
    ppVar12 = (ptls_raw_extension_t *)((long)&local_c8->type + 1);
    uVar13 = (ulong)(byte)local_c8->type;
    local_c8 = ppVar12;
    if ((ulong)((long)end - (long)ppVar12) < uVar13) goto LAB_001263b5;
    bVar29 = uVar13 != 0;
    if (bVar29) {
      (ch->compression_methods).ids = (uint8_t *)ppVar12;
      local_c8 = (ptls_raw_extension_t *)((long)&ppVar12->type + uVar13);
      (ch->compression_methods).count = uVar13;
      uVar8 = uVar19;
    }
  }
  if (!bVar29) {
    return uVar8;
  }
  if (local_c8 == (ptls_raw_extension_t *)end) {
    return 0;
  }
  ch->first_extension_at = (size_t)((long)local_c8 + (2 - (long)src));
  local_38.bits = 0;
  if (1 < (ulong)((long)end - (long)local_c8)) {
    lVar20 = 2;
    uVar13 = 0;
    do {
      ppVar12 = local_c8;
      local_c8 = (ptls_raw_extension_t *)((long)&ppVar12->type + 1);
      uVar13 = (ulong)(byte)ppVar12->type | uVar13 << 8;
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
    pbVar26 = (byte *)((long)&ppVar12->type + 1);
    uVar16 = (long)end - (long)pbVar26;
    if (uVar13 <= uVar16) {
      ppVar12 = (ptls_raw_extension_t *)(pbVar26 + uVar13);
      uVar13 = CONCAT71((int7)(uVar16 >> 8),ppVar12 == local_c8);
      if (ppVar12 != local_c8) {
        local_58 = &(ch->psk).identities;
        local_48 = &ch->signature_algorithms;
        local_60 = &ch->alpn;
        local_50 = &ch->server_name;
        local_a1 = properties != (ptls_handshake_properties_t *)0x0 && tls_cbarg != (ptls_t *)0x0;
        local_68 = ch->unknown_extensions;
        local_70 = &(ch->psk).identities.list[0].binder.len;
        local_b8 = ppVar12;
        local_88 = tls_cbarg;
        local_80 = properties;
        local_40 = ctx;
        while (uVar8 = 0x32, 1 < (long)ppVar12 - (long)local_c8) {
          extid = local_c8->type << 8 | local_c8->type >> 8;
          local_98 = (ptls_t *)(ulong)extid;
          local_c8 = (ptls_raw_extension_t *)&local_c8->field_0x2;
          local_bc = (uint)uVar13;
          local_78 = local_98;
          iVar9 = extension_bitmap_testandset(&local_38,1,extid);
          if (iVar9 == 0) {
            uVar8 = 0x2f;
            uVar13 = (ulong)local_bc;
            break;
          }
          uVar8 = 0x32;
          if ((ulong)((long)ppVar12 - (long)local_c8) < 2) {
LAB_00126614:
            bVar29 = false;
            uVar13 = (ulong)local_bc;
            goto LAB_00126d2c;
          }
          lVar20 = 2;
          uVar13 = 0;
          ppVar11 = local_c8;
          do {
            ppVar12 = local_c8;
            ppVar11 = (ptls_raw_extension_t *)((long)&ppVar11->type + 1);
            lVar25 = uVar13 * 0x100;
            local_c8 = (ptls_raw_extension_t *)((long)&ppVar12->type + 1);
            uVar16 = (ulong)(byte)ppVar12->type;
            uVar13 = lVar25 + uVar16;
            lVar20 = lVar20 + -1;
          } while (lVar20 != 0);
          pVar31.base = (ptls_raw_extension_t *)((long)&ppVar12->type + 1);
          uVar19 = 0;
          ppVar12 = local_b8;
          if ((ulong)((long)local_b8 - (long)pVar31.base) < uVar13) goto LAB_00126614;
          puVar1 = &(ch->psk).field_0xb4;
          *puVar1 = *puVar1 & 0xfd;
          psVar5 = local_40->on_extension;
          if (psVar5 != (st_ptls_on_extension_t *)0x0 && local_88 != (ptls_t *)0x0) {
            pVar31.len = uVar13;
            local_b0 = pVar31.base;
            iVar9 = (*psVar5->cb)(psVar5,local_88,'\x01',(uint16_t)local_98,pVar31);
            bVar30 = true;
            uVar19 = (uint)(iVar9 != 0);
            pVar31.base = local_b0;
            ppVar12 = local_c8;
            uVar10 = uVar19;
            if (iVar9 == 0) goto LAB_00126684;
            goto LAB_0012667b;
          }
LAB_00126684:
          ppVar17 = local_c8;
          pVar31.base = (ptls_raw_extension_t *)((long)pVar31.base + uVar13);
          iVar9 = (int)local_98;
          uVar13 = (ulong)local_bc;
          if (iVar9 < 0x29) {
            if (iVar9 < 0xd) {
              if (iVar9 == 0) {
                uVar10 = client_hello_decode_server_name
                                   (local_50,(uint8_t **)&local_c8,(uint8_t *)pVar31.base);
                bVar30 = true;
                ppVar12 = local_c8;
                if (uVar10 == 0) {
                  if (pVar31.base == local_c8) {
                    uVar10 = 0;
                    goto LAB_001273c0;
                  }
LAB_00127296:
                  bVar29 = true;
                  uVar13 = (ulong)local_bc;
                  uVar8 = 0x32;
                  goto LAB_00126d23;
                }
                goto LAB_0012667b;
              }
              if (iVar9 == 5) {
                ch->field_0x228 = ch->field_0x228 | 1;
              }
              else {
                if (iVar9 != 10) goto switchD_001266af_caseD_2e;
                (ch->negotiated_groups).base = (uint8_t *)local_c8;
                (ch->negotiated_groups).len = (long)pVar31.base - (long)local_c8;
              }
              goto LAB_00126d1d;
            }
            if (0x13 < iVar9) {
              if (iVar9 == 0x14) {
                uVar10 = 0x32;
                bVar29 = true;
                if (pVar31.base != local_c8) {
                  ppVar12 = (ptls_raw_extension_t *)((long)&local_c8->type + 1);
                  bVar3 = (byte)local_c8->type;
                  uVar13 = (ulong)bVar3;
                  local_c8 = ppVar12;
                  if (uVar13 <= (ulong)((long)pVar31.base - (long)ppVar12)) {
                    ppVar11 = (ptls_raw_extension_t *)((long)&ppVar12->type + uVar13);
                    uVar8 = 0x32;
                    bVar30 = true;
                    if ((uVar13 == 0) || ((bVar3 == 1 && ((byte)ppVar12->type == 0)))) {
                      bVar6 = false;
                    }
                    else {
                      do {
                        uVar13 = (ch->server_certificate_types).count;
                        if (uVar13 < 8) {
                          uVar7 = ppVar12->type;
                          (ch->server_certificate_types).count = uVar13 + 1;
                          (ch->server_certificate_types).list[uVar13] = (byte)uVar7;
                        }
                        ppVar12 = (ptls_raw_extension_t *)((long)&ppVar12->type + 1);
                      } while (ppVar12 != ppVar11);
                      bVar30 = false;
                      bVar6 = true;
                      uVar8 = uVar19;
                      local_c8 = ppVar12;
                    }
                    uVar10 = 0x32;
                    if (local_c8 == ppVar11) {
                      uVar10 = uVar8;
                    }
                    bVar29 = local_c8 != ppVar11;
                    if (!bVar6) {
                      uVar10 = uVar8;
                      bVar29 = bVar30;
                    }
                  }
                }
                if (bVar29) goto LAB_0012737b;
                if (pVar31.base == local_c8) goto LAB_001273c0;
              }
              else {
                if (iVar9 != 0x1b) goto switchD_001266af_caseD_2e;
                bVar29 = true;
                uVar19 = 0x32;
                if (pVar31.base != local_c8) {
                  ppVar12 = (ptls_raw_extension_t *)((long)&local_c8->type + 1);
                  uVar13 = (ulong)(byte)local_c8->type;
                  local_c8 = ppVar12;
                  if (uVar13 <= (ulong)((long)pVar31.base - (long)ppVar12)) {
                    ppVar11 = (ptls_raw_extension_t *)((long)&ppVar12->type + uVar13);
                    do {
                      lVar20 = (long)ppVar11 - (long)ppVar12;
                      uVar19 = 0x32;
                      if (1 < lVar20) {
                        local_9a = ppVar12->type << 8 | ppVar12->type >> 8;
                        ppVar12 = (ptls_raw_extension_t *)&ppVar12->field_0x2;
                        uVar19 = 0;
                        local_c8 = ppVar12;
                      }
                      bVar29 = true;
                      if (1 < lVar20) {
                        uVar13 = (ch->cert_compression_algos).count;
                        bVar29 = false;
                        if (uVar13 < 0x10) {
                          (ch->cert_compression_algos).count = uVar13 + 1;
                          (ch->cert_compression_algos).list[uVar13] = local_9a;
                        }
                      }
                      if (lVar20 < 2) goto LAB_001272ea;
                    } while (ppVar12 != ppVar11);
                    bVar29 = false;
                  }
                }
LAB_001272ea:
                if (bVar29) goto LAB_001272ee;
                if (pVar31.base == local_c8) goto LAB_00127315;
              }
              goto LAB_00127631;
            }
            if (iVar9 == 0xd) {
              local_b0 = pVar31.base;
              uVar10 = decode_signature_algorithms
                                 (local_48,(uint8_t **)&local_c8,(uint8_t *)pVar31.base);
              if (uVar10 != 0) {
                bVar30 = true;
                ppVar12 = local_c8;
                goto LAB_0012667b;
              }
              uVar10 = 0;
              goto LAB_00127649;
            }
            if (iVar9 != 0x10) goto switchD_001266af_caseD_2e;
            bVar30 = true;
            uVar8 = 0x32;
            if (1 < (ulong)((long)pVar31.base - (long)local_c8)) {
              pbVar15 = (byte *)((long)ppVar11 + ((lVar25 + uVar16) - (long)local_c8));
              lVar20 = 1;
              pbVar26 = (byte *)0x0;
              ppVar12 = local_c8;
              do {
                uVar13 = (long)pbVar26 * 0x100;
                local_c8 = (ptls_raw_extension_t *)((long)&ppVar12->type + 1);
                uVar16 = (ulong)(byte)ppVar12->type;
                pbVar26 = (byte *)(uVar13 + uVar16);
                pbVar15 = pbVar15 + -1;
                bVar29 = lVar20 != 0;
                lVar20 = lVar20 + -1;
                ppVar12 = local_c8;
              } while (bVar29);
              if (pbVar26 <= pbVar15) {
                uVar13 = uVar13 | uVar16;
                ppVar11 = (ptls_raw_extension_t *)((long)&local_c8->type + uVar13);
                do {
                  bVar30 = true;
                  ppVar14 = ppVar12;
                  if (ppVar11 == ppVar12) {
LAB_00126e6f:
                    bVar29 = false;
                    uVar19 = 0x32;
                  }
                  else {
                    ppVar14 = (ptls_raw_extension_t *)((long)&ppVar12->type + 1);
                    pbVar26 = (byte *)(ulong)(byte)ppVar12->type;
                    local_c8 = ppVar14;
                    if (((byte *)((long)ppVar17 + ((uVar13 - (long)ppVar12) - lVar20)) < pbVar26) ||
                       (pbVar26 == (byte *)0x0)) goto LAB_00126e6f;
                    uVar16 = (ch->alpn).count;
                    if (uVar16 < 0x10) {
                      (ch->alpn).count = uVar16 + 1;
                      local_60->list[uVar16].base = (uint8_t *)ppVar14;
                      local_60->list[uVar16].len = (size_t)pbVar26;
                    }
                    ppVar14 = (ptls_raw_extension_t *)((long)&ppVar14->type + (long)pbVar26);
                    bVar30 = false;
                    bVar29 = true;
                    local_c8 = ppVar14;
                  }
                  uVar8 = uVar19;
                  if (!bVar29) goto LAB_00126e88;
                  ppVar12 = ppVar14;
                } while (ppVar11 != ppVar14);
                bVar30 = false;
              }
            }
LAB_00126e88:
            uVar19 = uVar8;
            ppVar12 = local_c8;
            uVar10 = uVar19;
            if (!bVar30) {
              if (pVar31.base != local_c8) goto LAB_00127631;
              uVar13 = (ulong)local_bc;
              goto LAB_00126d1d;
            }
            goto LAB_0012667b;
          }
          switch(iVar9) {
          case 0x29:
            bVar29 = true;
            if ((ulong)((long)pVar31.base - (long)local_c8) < 2) {
              local_98 = (ptls_t *)0x0;
              local_a0 = uVar19;
              uVar19 = 0x32;
            }
            else {
              lVar20 = 2;
              uVar13 = 0;
              ppVar12 = local_c8;
              do {
                ppVar14 = local_c8;
                ppVar12 = (ptls_raw_extension_t *)((long)&ppVar12->type + 1);
                lVar21 = uVar13 * 0x100;
                ppVar17 = (ptls_raw_extension_t *)((long)&ppVar14->type + 1);
                uVar22 = (ulong)(byte)ppVar14->type;
                uVar13 = lVar21 + uVar22;
                lVar20 = lVar20 + -1;
                local_c8 = ppVar17;
              } while (lVar20 != 0);
              pbVar26 = (byte *)((long)&ppVar14->type + 1);
              if ((ulong)((long)pVar31.base - (long)pbVar26) < uVar13) {
                local_98 = (ptls_t *)0x0;
                local_b0 = pVar31.base;
                local_a0 = uVar19;
                uVar19 = 0x32;
              }
              else {
                ppVar14 = (ptls_raw_extension_t *)(pbVar26 + uVar13);
                local_98 = (ptls_t *)0x0;
                local_a0 = uVar19;
                do {
                  bVar29 = true;
                  if ((ulong)((long)ppVar14 - (long)ppVar17) < 2) {
                    pbVar26 = (byte *)0x0;
                    bVar30 = false;
                    ppVar18 = (ptls_raw_extension_t *)0x0;
                    uVar19 = 0x32;
                  }
                  else {
                    pbVar15 = (byte *)((long)ppVar12 + ((uVar22 + lVar21) - (long)ppVar17));
                    lVar20 = -2;
                    pbVar26 = (byte *)0x0;
                    do {
                      uVar28 = (long)pbVar26 * 0x100;
                      local_c8 = (ptls_raw_extension_t *)((long)&ppVar17->type + 1);
                      uVar13 = (ulong)(byte)ppVar17->type;
                      pbVar26 = (byte *)(uVar28 + uVar13);
                      pbVar15 = pbVar15 + -1;
                      lVar20 = lVar20 + 1;
                      ppVar17 = local_c8;
                    } while (lVar20 != 0);
                    bVar30 = false;
                    local_a0 = uVar19;
                    if ((long)pbVar26 < 1 || pbVar15 < pbVar26) {
                      ppVar18 = (ptls_raw_extension_t *)0x0;
                      pbVar26 = (byte *)0x0;
                      uVar19 = 0x32;
                    }
                    else {
                      ppVar17 = (ptls_raw_extension_t *)((long)&local_c8->type + (uVar28 | uVar13));
                      bVar30 = true;
                      bVar29 = false;
                      ppVar18 = local_c8;
                      local_c8 = ppVar17;
                    }
                  }
                  if (bVar30) {
                    lVar20 = (long)ppVar14 - (long)ppVar17;
                    if (lVar20 < 4) {
                      uVar19 = 0x32;
                      uVar24 = 0;
                    }
                    else {
                      uVar8 = *(uint *)ppVar17;
                      uVar24 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                               uVar8 << 0x18;
                      ppVar17 = (ptls_raw_extension_t *)&ppVar17->field_0x4;
                      uVar19 = 0;
                      local_c8 = ppVar17;
                    }
                    bVar29 = true;
                    if (3 < lVar20) {
                      uVar13 = (ch->psk).identities.count;
                      if (uVar13 < 4) {
                        (ch->psk).identities.count = uVar13 + 1;
                        local_58->list[uVar13].identity.base = (uint8_t *)ppVar18;
                        local_58->list[uVar13].identity.len = (size_t)pbVar26;
                        local_58->list[uVar13].obfuscated_ticket_age = uVar24;
                        puVar1 = &local_58->list[uVar13].field_0x14;
                        *(undefined8 *)puVar1 = 0;
                        *(undefined8 *)(puVar1 + 8) = 0;
                        *(undefined4 *)((long)&local_58->list[uVar13].binder.len + 4) = 0;
                      }
                      local_98 = (ptls_t *)((long)local_98 + 1);
                      bVar29 = false;
                      uVar19 = 0;
                    }
                  }
                  local_b0 = pVar31.base;
                  if (bVar29) goto LAB_0012712f;
                } while (ppVar14 != ppVar17);
                bVar29 = false;
              }
            }
LAB_0012712f:
            ppVar12 = local_c8;
            if (!bVar29) {
              (ch->psk).hash_end = (uint8_t *)local_c8;
              uVar8 = 0x32;
              bVar29 = true;
              if (1 < (ulong)((long)pVar31.base - (long)local_c8)) {
                pbVar15 = (byte *)((long)ppVar11 + ((lVar25 + uVar16) - (long)local_c8));
                lVar20 = 1;
                pbVar26 = (byte *)0x0;
                ppVar11 = local_c8;
                do {
                  uVar16 = (long)pbVar26 * 0x100;
                  local_c8 = (ptls_raw_extension_t *)((long)&ppVar11->type + 1);
                  uVar13 = (ulong)(byte)ppVar11->type;
                  pbVar26 = (byte *)(uVar16 + uVar13);
                  pbVar15 = pbVar15 + -1;
                  bVar30 = lVar20 != 0;
                  lVar20 = lVar20 + -1;
                  ppVar11 = local_c8;
                } while (bVar30);
                if (pbVar26 <= pbVar15) {
                  uVar16 = uVar16 | uVar13;
                  ppVar17 = (ptls_raw_extension_t *)((long)&local_c8->type + uVar16);
                  uVar13 = 0;
                  psVar23 = local_70;
                  do {
                    bVar30 = true;
                    ppVar14 = ppVar11;
                    if (ppVar17 == ppVar11) {
LAB_001271f5:
                      bVar29 = false;
                      uVar19 = 0x32;
                    }
                    else {
                      ppVar14 = (ptls_raw_extension_t *)((long)&ppVar11->type + 1);
                      pbVar26 = (byte *)(ulong)(byte)ppVar11->type;
                      local_c8 = ppVar14;
                      if ((byte *)((long)ppVar12 + ((uVar16 - (long)ppVar11) - lVar20)) < pbVar26)
                      goto LAB_001271f5;
                      if (uVar13 < (ch->psk).identities.count) {
                        ((ptls_iovec_t *)(psVar23 + -1))->base = (uint8_t *)ppVar14;
                        *psVar23 = (size_t)pbVar26;
                      }
                      ppVar14 = (ptls_raw_extension_t *)((long)&ppVar14->type + (long)pbVar26);
                      bVar30 = false;
                      bVar29 = true;
                      local_c8 = ppVar14;
                    }
                    if (!bVar29) goto LAB_00127243;
                    uVar13 = uVar13 + 1;
                    psVar23 = psVar23 + 5;
                    ppVar11 = ppVar14;
                  } while (ppVar17 != ppVar14);
                  bVar30 = local_98 != (ptls_t *)uVar13;
                  if (bVar30) {
                    uVar19 = 0x2f;
                  }
LAB_00127243:
                  uVar8 = 0x32;
                  if (ppVar17 == local_c8) {
                    uVar8 = uVar19;
                  }
                  bVar29 = ppVar17 != local_c8;
                  if (bVar30) {
                    uVar8 = uVar19;
                    bVar29 = bVar30;
                  }
                }
              }
              uVar19 = uVar8;
              local_b0 = pVar31.base;
              if (!bVar29) {
                if (pVar31.base == local_c8) {
                  puVar1 = &(ch->psk).field_0xb4;
                  *puVar1 = *puVar1 | 2;
                  bVar29 = false;
                }
                else {
                  uVar19 = 0x32;
                  bVar29 = true;
                }
              }
            }
            uVar13 = (ulong)local_bc;
            uVar8 = uVar19;
            if (!bVar29) break;
            goto LAB_00126d23;
          case 0x2a:
            puVar1 = &(ch->psk).field_0xb4;
            *puVar1 = *puVar1 | 1;
            break;
          case 0x2b:
            uVar10 = 0x32;
            bVar30 = true;
            if (pVar31.base != local_c8) {
              ppVar12 = (ptls_raw_extension_t *)((long)&local_c8->type + 1);
              uVar13 = (ulong)(byte)local_c8->type;
              local_c8 = ppVar12;
              if (uVar13 <= (ulong)((long)pVar31.base - (long)ppVar12)) {
                ppVar11 = (ptls_raw_extension_t *)((long)&ppVar12->type + uVar13);
                lVar20 = 1;
                do {
                  lVar25 = (long)ppVar11 - (long)ppVar12;
                  uVar8 = 0x32;
                  if (1 < lVar25) {
                    local_8a = ppVar12->type << 8 | ppVar12->type >> 8;
                    ppVar12 = (ptls_raw_extension_t *)&ppVar12->field_0x2;
                    uVar8 = 0;
                    local_c8 = ppVar12;
                  }
                  bVar29 = true;
                  if (1 < lVar25) {
                    lVar21 = lVar20;
                    if (lVar20 == 0) {
                      bVar29 = false;
                    }
                    else {
                      do {
                        bVar29 = false;
                        if (local_8a == 0x304) {
                          lVar20 = 0;
                          break;
                        }
                        lVar21 = lVar21 + -1;
                      } while (lVar21 != 0);
                    }
                  }
                  if (lVar25 < 2) goto LAB_00126b9b;
                } while (ppVar12 != ppVar11);
                bVar29 = false;
                if (lVar20 != 1) {
                  ch->selected_version = 0x304;
                  bVar29 = false;
                }
LAB_00126b9b:
                uVar10 = 0x32;
                if (local_c8 == ppVar11) {
                  uVar10 = uVar8;
                }
                bVar30 = local_c8 != ppVar11;
                if (bVar29) {
                  uVar10 = uVar8;
                  bVar30 = bVar29;
                }
              }
            }
            ppVar12 = local_c8;
            local_b0 = pVar31.base;
            if (bVar30) goto LAB_0012667b;
            goto joined_r0x0012762f;
          case 0x2c:
            bVar30 = true;
            bVar29 = true;
            if (local_80 == (st_ptls_handshake_properties_t *)0x0) {
              uVar10 = 0x2f;
LAB_0012737b:
              uVar13 = (ulong)local_bc;
              uVar8 = uVar10;
              goto LAB_00126d23;
            }
            if ((local_80->field_0).server.cookie.key == (void *)0x0) {
              ppVar12 = local_c8;
              uVar10 = 0x2f;
              goto LAB_0012667b;
            }
            (ch->cookie).all.base = (uint8_t *)local_c8;
            (ch->cookie).all.len = (long)pVar31.base - (long)local_c8;
            uVar10 = 0x32;
            ppVar12 = local_c8;
            bVar30 = true;
            if (1 < (ulong)((long)pVar31.base - (long)local_c8)) {
              lVar20 = 2;
              uVar13 = 0;
              do {
                ppVar11 = ppVar12;
                lVar25 = uVar13 * 0x100;
                ppVar12 = (ptls_raw_extension_t *)((long)&ppVar11->type + 1);
                uVar16 = (ulong)(byte)ppVar11->type;
                uVar13 = lVar25 + uVar16;
                local_c8 = (ptls_raw_extension_t *)((long)&local_c8->type + 1);
                lVar20 = lVar20 + -1;
              } while (lVar20 != 0);
              pbVar26 = (byte *)((long)&ppVar11->type + 1);
              if (uVar13 <= (ulong)((long)pVar31.base - (long)pbVar26)) {
                (ch->cookie).tbs.base = pbVar26;
                uVar10 = 0x32;
                bVar30 = true;
                ppVar17 = ppVar12;
                if (1 < uVar13) {
                  lVar20 = 0;
                  pbVar15 = (byte *)0x0;
                  do {
                    uVar28 = (long)pbVar15 * 0x100;
                    pbVar15 = (byte *)((long)&ppVar12->type + lVar20);
                    ppVar17 = (ptls_raw_extension_t *)(pbVar15 + 1);
                    uVar22 = (ulong)*pbVar15;
                    pbVar15 = (byte *)(uVar28 + uVar22);
                    lVar20 = lVar20 + 1;
                  } while (lVar20 != 2);
                  if (pbVar15 <= (byte *)((long)local_c8 + uVar16 + (lVar25 - (long)ppVar12) + -2))
                  {
                    uVar10 = 0x32;
                    bVar30 = true;
                    if (pbVar15 == (byte *)0x0) {
                      bVar29 = false;
                      local_c8 = ppVar17;
                    }
                    else {
                      local_c8 = (ptls_raw_extension_t *)&ppVar11->field_0x4;
                      pbVar27 = (byte *)(ulong)(byte)ppVar11->field_0x3;
                      bVar29 = false;
                      if (pbVar27 <=
                          (byte *)((long)ppVar11 + (((uVar28 | uVar22) + 3) - (long)local_c8))) {
                        (ch->cookie).ch1_hash.base = (uint8_t *)local_c8;
                        (ch->cookie).ch1_hash.len = (size_t)pbVar27;
                        bVar29 = true;
                        bVar30 = false;
                        local_c8 = (ptls_raw_extension_t *)(&ppVar12->field_0x3 + (long)pbVar27);
                        uVar10 = uVar19;
                      }
                    }
                    ppVar12 = local_c8;
                    ppVar17 = local_c8;
                    if (bVar29) {
                      ppVar11 = (ptls_raw_extension_t *)((long)&ppVar11->type + (long)(pbVar15 + 3))
                      ;
                      if (ppVar11 == local_c8) {
                        uVar10 = 0x32;
                      }
                      else {
                        local_a3 = (byte)local_c8->type;
                        uVar10 = 0;
                        local_c8 = (ptls_raw_extension_t *)((long)&local_c8->type + 1);
                      }
                      bVar30 = true;
                      if (ppVar11 == ppVar12) {
LAB_00127582:
                        bVar29 = false;
                      }
                      else {
                        uVar10 = 0;
                        if (local_a3 == 1) {
                          puVar1 = &(ch->cookie).field_0x40;
                          *puVar1 = *puVar1 | 1;
                          bVar29 = true;
                          bVar30 = false;
                        }
                        else {
                          if (local_a3 != 0) {
                            uVar10 = 0x32;
                            goto LAB_00127582;
                          }
                          if (((ch->cookie).field_0x40 & 1) != 0) {
                            local_b0 = pVar31.base;
                            __assert_fail("!ch->cookie.sent_key_share",
                                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                                          ,0xec2,
                                          "int decode_client_hello(ptls_context_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *, ptls_t *)"
                                         );
                          }
                          bVar30 = false;
                          bVar29 = true;
                          uVar10 = 0;
                        }
                      }
                      ppVar17 = local_c8;
                      if ((bVar29) && (bVar30 = ppVar11 != local_c8, bVar30)) {
                        uVar10 = 0x32;
                      }
                    }
                  }
                }
                local_c8 = ppVar17;
                ppVar12 = local_c8;
                if (!bVar30) {
                  ppVar11 = (ptls_raw_extension_t *)(pbVar26 + uVar13);
                  (ch->cookie).tbs.len = (long)local_c8 - (long)pbVar26;
                  bVar30 = true;
                  uVar8 = 0x32;
                  if (ppVar11 == local_c8) {
                    bVar29 = false;
                  }
                  else {
                    ppVar12 = (ptls_raw_extension_t *)((long)&local_c8->type + 1);
                    uVar13 = (ulong)(byte)local_c8->type;
                    bVar29 = false;
                    local_c8 = ppVar12;
                    if (uVar13 <= (ulong)((long)ppVar11 - (long)ppVar12)) {
                      (ch->cookie).signature.base = (uint8_t *)ppVar12;
                      local_c8 = (ptls_raw_extension_t *)((long)&ppVar12->type + uVar13);
                      (ch->cookie).signature.len = uVar13;
                      bVar29 = true;
                      bVar30 = false;
                      uVar8 = uVar10;
                    }
                  }
                  uVar10 = uVar8;
                  ppVar12 = local_c8;
                  if ((bVar29) && (bVar30 = ppVar11 != local_c8, bVar30)) {
                    uVar10 = 0x32;
                  }
                }
              }
            }
            local_c8 = ppVar12;
            ppVar12 = local_c8;
            local_b0 = pVar31.base;
            if (bVar30) goto LAB_0012667b;
joined_r0x0012762f:
            local_b0 = pVar31.base;
            if (pVar31.base == local_c8) {
LAB_00127649:
              uVar13 = (ulong)local_bc;
              pVar31.base = local_b0;
              uVar19 = uVar10;
              break;
            }
LAB_00127631:
            uVar10 = 0x32;
LAB_00127637:
            bVar30 = true;
            ppVar12 = local_c8;
LAB_0012667b:
            local_c8 = ppVar12;
            uVar13 = (ulong)local_bc;
            uVar8 = uVar10;
            bVar29 = bVar30;
            goto LAB_00126d23;
          case 0x2d:
            bVar29 = true;
            uVar19 = 0x32;
            if (pVar31.base != local_c8) {
              ppVar12 = (ptls_raw_extension_t *)((long)&local_c8->type + 1);
              uVar13 = (ulong)(byte)local_c8->type;
              local_c8 = ppVar12;
              if (uVar13 <= (ulong)((long)pVar31.base - (long)ppVar12)) {
                ppVar11 = (ptls_raw_extension_t *)((long)&ppVar12->type + uVar13);
                do {
                  if (ppVar12 == ppVar11) {
                    uVar19 = 0x32;
                    bVar29 = true;
                    ppVar17 = ppVar12;
                  }
                  else {
                    local_c8 = (ptls_raw_extension_t *)((long)&ppVar12->type + 1);
                    local_a2 = (byte)ppVar12->type;
                    uVar19 = 0;
                    bVar29 = false;
                    ppVar17 = local_c8;
                    if (local_a2 < 0x20) {
                      puVar2 = &(ch->psk).ke_modes;
                      *puVar2 = *puVar2 | 1 << (local_a2 & 0x1f);
                    }
                  }
                  if (ppVar12 == ppVar11) goto LAB_001272c5;
                  ppVar12 = ppVar17;
                } while (ppVar17 != ppVar11);
                bVar29 = false;
              }
            }
LAB_001272c5:
            if (bVar29) {
LAB_001272ee:
              uVar13 = (ulong)local_bc;
              uVar8 = uVar19;
              goto LAB_00126d23;
            }
            if (pVar31.base != local_c8) goto LAB_00127631;
LAB_00127315:
            uVar13 = (ulong)local_bc;
            break;
          case 0x2e:
          case 0x2f:
          case 0x30:
          case 0x31:
          case 0x32:
switchD_001266af_caseD_2e:
            if (local_a1 == '\0') break;
            local_b0 = pVar31.base;
            local_a0 = uVar19;
            if ((local_80->collect_extension ==
                 (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0) ||
               (iVar9 = (*local_80->collect_extension)(local_88,local_80,(uint16_t)local_98),
               iVar9 == 0)) {
              uVar13 = (ulong)local_bc;
              pVar31.base = local_b0;
              uVar19 = local_a0;
              break;
            }
            uVar10 = collect_unknown_extension
                               (local_98,(uint16_t)local_c8,(uint8_t *)local_b0,(uint8_t *)local_68,
                                pVar31.base);
            if (uVar10 == 0) {
              uVar10 = 0;
              goto LAB_00127649;
            }
            goto LAB_00127637;
          case 0x33:
            (ch->key_shares).base = (uint8_t *)local_c8;
            (ch->key_shares).len = (long)pVar31.base - (long)local_c8;
            break;
          default:
            if (iVar9 != 0x3a) {
              if (iVar9 == 0xfe0d) {
                if (pVar31.base == local_c8) {
                  uVar10 = 0x32;
                }
                else {
                  (ch->ech).type = (byte)local_c8->type;
                  uVar10 = 0;
                  local_c8 = (ptls_raw_extension_t *)((long)&local_c8->type + 1);
                }
                bVar30 = true;
                bVar29 = true;
                ppVar12 = local_c8;
                if (pVar31.base != ppVar17) {
                  uVar4 = (ch->ech).type;
                  if (uVar4 == '\x01') {
                    if (pVar31.base != local_c8) goto LAB_00127296;
                    (ch->ech).payload.base = "";
                    (ch->ech).payload.len = 0;
                    uVar10 = 0;
LAB_001273c0:
                    uVar13 = (ulong)local_bc;
                    uVar19 = uVar10;
                    break;
                  }
                  if (uVar4 != '\0') {
                    uVar13 = (ulong)local_bc;
                    uVar8 = 0x2f;
                    goto LAB_00126d23;
                  }
                  uVar10 = 0x32;
                  if (1 < (long)pVar31.base - (long)local_c8) {
                    (ch->ech).cipher_suite.kdf = local_c8->type << 8 | local_c8->type >> 8;
                    ppVar12 = (ptls_raw_extension_t *)&local_c8->field_0x2;
                    uVar10 = 0x32;
                    if (1 < (long)pVar31.base - (long)ppVar12) {
                      (ch->ech).cipher_suite.aead =
                           *(ushort *)ppVar12 << 8 | *(ushort *)ppVar12 >> 8;
                      ppVar12 = (ptls_raw_extension_t *)&local_c8->field_0x4;
                      if (pVar31.base == ppVar12) {
                        uVar10 = 0x32;
                      }
                      else {
                        local_c8 = (ptls_raw_extension_t *)&local_c8->field_0x5;
                        (ch->ech).config_id = *(uint8_t *)ppVar12;
                        uVar8 = 0x32;
                        bVar29 = true;
                        if ((ulong)((long)pVar31.base - (long)local_c8) < 2) {
                          bVar30 = false;
                        }
                        else {
                          pbVar26 = (byte *)((long)ppVar11 + uVar16 + (lVar25 - (long)local_c8));
                          lVar20 = -2;
                          pbVar15 = (byte *)0x0;
                          ppVar12 = local_c8;
                          do {
                            local_c8 = (ptls_raw_extension_t *)((long)&ppVar12->type + 1);
                            pbVar15 = (byte *)((ulong)(byte)ppVar12->type | (long)pbVar15 << 8);
                            pbVar26 = pbVar26 + -1;
                            lVar20 = lVar20 + 1;
                            ppVar12 = local_c8;
                          } while (lVar20 != 0);
                          bVar30 = false;
                          if (pbVar15 <= pbVar26) {
                            (ch->ech).enc.base = (uint8_t *)local_c8;
                            local_c8 = (ptls_raw_extension_t *)
                                       ((long)&local_c8->type + (long)pbVar15);
                            (ch->ech).enc.len = (size_t)pbVar15;
                            bVar30 = true;
                            bVar29 = false;
                            uVar8 = 0;
                          }
                        }
                        if (!bVar30) {
                          uVar13 = (ulong)local_bc;
                          goto LAB_00126d23;
                        }
                        bVar30 = true;
                        uVar10 = 0x32;
                        if ((ulong)((long)pVar31.base - (long)local_c8) < 2) {
                          bVar29 = false;
                        }
                        else {
                          pbVar26 = (byte *)((long)ppVar11 + ((lVar25 + uVar16) - (long)local_c8));
                          lVar20 = -2;
                          uVar13 = 0;
                          ppVar12 = local_c8;
                          do {
                            local_c8 = (ptls_raw_extension_t *)((long)&ppVar12->type + 1);
                            uVar13 = (ulong)(byte)ppVar12->type | uVar13 << 8;
                            pbVar26 = pbVar26 + -1;
                            lVar20 = lVar20 + 1;
                            ppVar12 = local_c8;
                          } while (lVar20 != 0);
                          bVar29 = false;
                          if ((byte *)(uVar13 - 1) < pbVar26) {
                            (ch->ech).payload.base = (uint8_t *)local_c8;
                            local_c8 = (ptls_raw_extension_t *)((long)&local_c8->type + uVar13);
                            (ch->ech).payload.len = uVar13;
                            bVar29 = true;
                            bVar30 = false;
                            uVar10 = uVar8;
                          }
                        }
                        ppVar12 = local_c8;
                        if (bVar29) goto LAB_001273c0;
                      }
                    }
                  }
                }
                goto LAB_0012667b;
              }
              goto switchD_001266af_caseD_2e;
            }
            if ((long)pVar31.base - (long)local_c8 != 2) {
              uVar10 = 0x32;
              bVar29 = true;
              goto LAB_0012737b;
            }
            (ch->ticket_request).new_session_count = (byte)local_c8->type;
            (ch->ticket_request).resumption_count = *(byte *)((long)&local_c8->type + 1);
          }
LAB_00126d1d:
          bVar29 = false;
          local_c8 = pVar31.base;
          uVar8 = uVar19;
LAB_00126d23:
          bVar29 = !bVar29;
          ppVar12 = local_b8;
LAB_00126d2c:
          if ((!bVar29) ||
             (uVar13 = CONCAT71((int7)(uVar13 >> 8),ppVar12 == local_c8), ppVar12 == local_c8))
          break;
        }
      }
      goto LAB_00126496;
    }
  }
  uVar13 = 0;
  uVar8 = 0x32;
LAB_00126496:
  if (((uVar13 & 1) != 0) && (uVar8 = 0x32, local_c8 == (ptls_raw_extension_t *)end)) {
    uVar8 = 0;
  }
  return uVar8;
}

Assistant:

static int decode_client_hello(ptls_context_t *ctx, struct st_ptls_client_hello_t *ch, const uint8_t *src, const uint8_t *const end,
                               ptls_handshake_properties_t *properties, ptls_t *tls_cbarg)
{
    const uint8_t *start = src;
    uint16_t exttype = 0;
    int ret;

    /* decode protocol version (do not bare to decode something older than TLS 1.0) */
    if ((ret = ptls_decode16(&ch->legacy_version, &src, end)) != 0)
        goto Exit;
    if (ch->legacy_version < 0x0301) {
        ret = PTLS_ALERT_PROTOCOL_VERSION;
        goto Exit;
    }

    /* skip random */
    if (end - src < PTLS_HELLO_RANDOM_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    ch->random_bytes = src;
    src += PTLS_HELLO_RANDOM_SIZE;

    /* skip legacy_session_id */
    ptls_decode_open_block(src, end, 1, {
        if (end - src > 32) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->legacy_session_id = ptls_iovec_init(src, end - src);
        src = end;
    });

    /* decode and select from ciphersuites */
    ptls_decode_open_block(src, end, 2, {
        if ((end - src) % 2 != 0) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->cipher_suites = ptls_iovec_init(src, end - src);
        src = end;
    });

    /* decode legacy_compression_methods */
    ptls_decode_open_block(src, end, 1, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->compression_methods.ids = src;
        ch->compression_methods.count = end - src;
        src = end;
    });

    /* In TLS versions 1.2 and earlier CH might not have an extensions block (or they might, see what OpenSSL 1.0.0 sends); so bail
     * out if that is the case after parsing the main variables. Zero is returned as it is a valid ClientHello. However
     * `ptls_t::selected_version` remains zero indicating that no compatible version were found. */
    if (src == end) {
        ret = 0;
        goto Exit;
    }

    /* decode extensions */
    ch->first_extension_at = src - start + 2;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, &exttype, {
        ch->psk.is_last_extension = 0;
        if (ctx->on_extension != NULL && tls_cbarg != NULL &&
            (ret = ctx->on_extension->cb(ctx->on_extension, tls_cbarg, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, exttype,
                                         ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_SERVER_NAME:
            if ((ret = client_hello_decode_server_name(&ch->server_name, &src, end)) != 0)
                goto Exit;
            if (src != end) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            break;
        case PTLS_EXTENSION_TYPE_ALPN:
            ptls_decode_block(src, end, 2, {
                do {
                    ptls_decode_open_block(src, end, 1, {
                        /* rfc7301 3.1: empty strings MUST NOT be included */
                        if (src == end) {
                            ret = PTLS_ALERT_DECODE_ERROR;
                            goto Exit;
                        }
                        if (ch->alpn.count < PTLS_ELEMENTSOF(ch->alpn.list))
                            ch->alpn.list[ch->alpn.count++] = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_SERVER_CERTIFICATE_TYPE:
            ptls_decode_block(src, end, 1, {
                size_t list_size = end - src;

                /* RFC7250 4.1: No empty list, no list with single x509 element */
                if (list_size == 0 || (list_size == 1 && *src == PTLS_CERTIFICATE_TYPE_X509)) {
                    ret = PTLS_ALERT_DECODE_ERROR;
                    goto Exit;
                }

                do {
                    if (ch->server_certificate_types.count < PTLS_ELEMENTSOF(ch->server_certificate_types.list))
                        ch->server_certificate_types.list[ch->server_certificate_types.count++] = *src;
                    src++;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE:
            ptls_decode_block(src, end, 1, {
                do {
                    uint16_t id;
                    if ((ret = ptls_decode16(&id, &src, end)) != 0)
                        goto Exit;
                    if (ch->cert_compression_algos.count < PTLS_ELEMENTSOF(ch->cert_compression_algos.list))
                        ch->cert_compression_algos.list[ch->cert_compression_algos.count++] = id;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS:
            ch->negotiated_groups = ptls_iovec_init(src, end - src);
            break;
        case PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS:
            if ((ret = decode_signature_algorithms(&ch->signature_algorithms, &src, end)) != 0)
                goto Exit;
            break;
        case PTLS_EXTENSION_TYPE_KEY_SHARE:
            ch->key_shares = ptls_iovec_init(src, end - src);
            break;
        case PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS:
            ptls_decode_block(src, end, 1, {
                size_t selected_index = PTLS_ELEMENTSOF(supported_versions);
                do {
                    size_t i;
                    uint16_t v;
                    if ((ret = ptls_decode16(&v, &src, end)) != 0)
                        goto Exit;
                    for (i = 0; i != selected_index; ++i) {
                        if (supported_versions[i] == v) {
                            selected_index = i;
                            break;
                        }
                    }
                } while (src != end);
                if (selected_index != PTLS_ELEMENTSOF(supported_versions))
                    ch->selected_version = supported_versions[selected_index];
            });
            break;
        case PTLS_EXTENSION_TYPE_COOKIE:
            if (properties == NULL || properties->server.cookie.key == NULL) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            ch->cookie.all = ptls_iovec_init(src, end - src);
            ptls_decode_block(src, end, 2, {
                ch->cookie.tbs.base = (void *)src;
                ptls_decode_open_block(src, end, 2, {
                    ptls_decode_open_block(src, end, 1, {
                        ch->cookie.ch1_hash = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    uint8_t sent_key_share;
                    if ((ret = ptls_decode8(&sent_key_share, &src, end)) != 0)
                        goto Exit;
                    switch (sent_key_share) {
                    case 0:
                        assert(!ch->cookie.sent_key_share);
                        break;
                    case 1:
                        ch->cookie.sent_key_share = 1;
                        break;
                    default:
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                });
                ch->cookie.tbs.len = src - ch->cookie.tbs.base;
                ptls_decode_block(src, end, 1, {
                    ch->cookie.signature = ptls_iovec_init(src, end - src);
                    src = end;
                });
            });
            break;
        case PTLS_EXTENSION_TYPE_PRE_SHARED_KEY: {
            size_t num_identities = 0;
            ptls_decode_open_block(src, end, 2, {
                do {
                    ptls_client_hello_psk_identity_t psk = {{NULL}};
                    ptls_decode_open_block(src, end, 2, {
                        if (end - src < 1) {
                            ret = PTLS_ALERT_DECODE_ERROR;
                            goto Exit;
                        }
                        psk.identity = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    if ((ret = ptls_decode32(&psk.obfuscated_ticket_age, &src, end)) != 0)
                        goto Exit;
                    if (ch->psk.identities.count < PTLS_ELEMENTSOF(ch->psk.identities.list))
                        ch->psk.identities.list[ch->psk.identities.count++] = psk;
                    ++num_identities;
                } while (src != end);
            });
            ch->psk.hash_end = src;
            ptls_decode_block(src, end, 2, {
                size_t num_binders = 0;
                do {
                    ptls_decode_open_block(src, end, 1, {
                        if (num_binders < ch->psk.identities.count)
                            ch->psk.identities.list[num_binders].binder = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    ++num_binders;
                } while (src != end);
                if (num_identities != num_binders) {
                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                    goto Exit;
                }
            });
            ch->psk.is_last_extension = 1;
        } break;
        case PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES:
            ptls_decode_block(src, end, 1, {
                do {
                    uint8_t mode;
                    if ((ret = ptls_decode8(&mode, &src, end)) != 0)
                        goto Exit;
                    if (mode < sizeof(ch->psk.ke_modes) * 8)
                        ch->psk.ke_modes |= 1u << mode;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            ch->psk.early_data_indication = 1;
            break;
        case PTLS_EXTENSION_TYPE_STATUS_REQUEST:
            ch->status_request = 1;
            break;
        case PTLS_EXTENSION_TYPE_TICKET_REQUEST:
            if (end - src != 2) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            ch->ticket_request.new_session_count = *src++;
            ch->ticket_request.resumption_count = *src++;
            break;
        case PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO:
            if ((ret = ptls_decode8(&ch->ech.type, &src, end)) != 0)
                goto Exit;
            switch (ch->ech.type) {
            case PTLS_ECH_CLIENT_HELLO_TYPE_OUTER:
                if ((ret = ptls_decode16(&ch->ech.cipher_suite.kdf, &src, end)) != 0 ||
                    (ret = ptls_decode16(&ch->ech.cipher_suite.aead, &src, end)) != 0)
                    goto Exit;
                if ((ret = ptls_decode8(&ch->ech.config_id, &src, end)) != 0)
                    goto Exit;
                ptls_decode_open_block(src, end, 2, {
                    ch->ech.enc = ptls_iovec_init(src, end - src);
                    src = end;
                });
                ptls_decode_open_block(src, end, 2, {
                    if (src == end) {
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                    ch->ech.payload = ptls_iovec_init(src, end - src);
                    src = end;
                });
                break;
            case PTLS_ECH_CLIENT_HELLO_TYPE_INNER:
                if (src != end) {
                    ret = PTLS_ALERT_DECODE_ERROR;
                    goto Exit;
                }
                ch->ech.payload = ptls_iovec_init("", 0); /* non-zero base indicates that the extension was received */
                break;
            default:
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            src = end;
            break;
        default:
            if (tls_cbarg != NULL && should_collect_unknown_extension(tls_cbarg, properties, exttype)) {
                if ((ret = collect_unknown_extension(tls_cbarg, exttype, src, end, ch->unknown_extensions)) != 0)
                    goto Exit;
            }
            break;
        }
        src = end;
    });

    ret = 0;
Exit:
    return ret;
}